

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutable_s2shape_index.cc
# Opt level: O0

void __thiscall MutableS2ShapeIndex::MutableS2ShapeIndex(MutableS2ShapeIndex *this,Options *options)

{
  Options *options_local;
  MutableS2ShapeIndex *this_local;
  
  S2ShapeIndex::S2ShapeIndex(&this->super_S2ShapeIndex);
  (this->super_S2ShapeIndex)._vptr_S2ShapeIndex = (_func_int **)&PTR__MutableS2ShapeIndex_0062ce90;
  std::
  vector<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>,_std::allocator<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>_>_>
  ::vector(&this->shapes_);
  gtl::
  btree_map<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256>
  ::btree_map(&this->cell_map_);
  (this->options_).max_edges_per_cell_ = options->max_edges_per_cell_;
  this->pending_additions_begin_ = 0;
  std::
  unique_ptr<std::vector<MutableS2ShapeIndex::RemovedShape,std::allocator<MutableS2ShapeIndex::RemovedShape>>,std::default_delete<std::vector<MutableS2ShapeIndex::RemovedShape,std::allocator<MutableS2ShapeIndex::RemovedShape>>>>
  ::
  unique_ptr<std::default_delete<std::vector<MutableS2ShapeIndex::RemovedShape,std::allocator<MutableS2ShapeIndex::RemovedShape>>>,void>
            ((unique_ptr<std::vector<MutableS2ShapeIndex::RemovedShape,std::allocator<MutableS2ShapeIndex::RemovedShape>>,std::default_delete<std::vector<MutableS2ShapeIndex::RemovedShape,std::allocator<MutableS2ShapeIndex::RemovedShape>>>>
              *)&this->pending_removals_);
  SpinLock::SpinLock(&this->lock_);
  std::atomic<MutableS2ShapeIndex::IndexStatus>::atomic(&this->index_status_,FRESH);
  std::
  unique_ptr<MutableS2ShapeIndex::UpdateState,std::default_delete<MutableS2ShapeIndex::UpdateState>>
  ::unique_ptr<std::default_delete<MutableS2ShapeIndex::UpdateState>,void>
            ((unique_ptr<MutableS2ShapeIndex::UpdateState,std::default_delete<MutableS2ShapeIndex::UpdateState>>
              *)&this->update_state_);
  return;
}

Assistant:

MutableS2ShapeIndex::MutableS2ShapeIndex(const Options& options)
    : options_(options),
      index_status_(FRESH) {
}